

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_b_term(parse *p,cset *cs)

{
  char cVar1;
  int local_20;
  char local_1b;
  char local_19;
  int i;
  char finish;
  char start;
  char c;
  cset *cs_local;
  parse *p_local;
  
  if (p->next < p->end) {
    cVar1 = *p->next;
  }
  else {
    cVar1 = '\0';
  }
  if (cVar1 == '-') {
    seterr(p,0xb);
  }
  else {
    if (cVar1 == '[') {
      if (p->next + 1 < p->end) {
        local_19 = p->next[1];
      }
      else {
        local_19 = '\0';
      }
    }
    else {
      local_19 = '\0';
    }
    if (local_19 == ':') {
      p->next = p->next + 2;
      if (p->end <= p->next) {
        seterr(p,7);
      }
      if ((*p->next == '-') || (*p->next == ']')) {
        seterr(p,4);
      }
      p_b_cclass(p,cs);
      if (p->end <= p->next) {
        seterr(p,7);
      }
      if ((((p->next < p->end) && (p->next + 1 < p->end)) && (*p->next == ':')) &&
         (p->next[1] == ']')) {
        p->next = p->next + 2;
      }
      else {
        seterr(p,4);
      }
    }
    else if (local_19 == '=') {
      p->next = p->next + 2;
      if (p->end <= p->next) {
        seterr(p,7);
      }
      if ((*p->next == '-') || (*p->next == ']')) {
        seterr(p,3);
      }
      p_b_eclass(p,cs);
      if (p->end <= p->next) {
        seterr(p,7);
      }
      if (((p->next < p->end) && (p->next + 1 < p->end)) &&
         ((*p->next == '=' && (p->next[1] == ']')))) {
        p->next = p->next + 2;
      }
      else {
        seterr(p,3);
      }
    }
    else {
      cVar1 = p_b_symbol(p);
      local_1b = cVar1;
      if ((((p->next < p->end) && (*p->next == '-')) && (p->next + 1 < p->end)) &&
         (p->next[1] != ']')) {
        p->next = p->next + 1;
        if ((p->next < p->end) && (*p->next == '-')) {
          p->next = p->next + 1;
          local_1b = '-';
        }
        else {
          local_1b = p_b_symbol(p);
        }
      }
      if (local_1b < cVar1) {
        seterr(p,0xb);
      }
      for (local_20 = (int)cVar1; local_20 <= local_1b; local_20 = local_20 + 1) {
        cs->ptr[local_20] = cs->ptr[local_20] | cs->mask;
        cs->hash = cs->hash + (char)local_20;
      }
    }
  }
  return;
}

Assistant:

static void
p_b_term(p, cs)
struct parse *p;
cset *cs;
{
	char c;
	char start, finish;
	int i;

	/* classify what we've got */
	switch ((MORE()) ? PEEK() : '\0') {
	case '[':
		c = (MORE2()) ? PEEK2() : '\0';
		break;
	case '-':
		seterr(p, REG_ERANGE);
		return;			/* NOTE RETURN */
		break;
	default:
		c = '\0';
		break;
	}

	switch (c) {
	case ':':		/* character class */
		NEXT2();
		REQUIRE(MORE(), REG_EBRACK);
		c = PEEK();
		REQUIRE(c != '-' && c != ']', REG_ECTYPE);
		p_b_cclass(p, cs);
		REQUIRE(MORE(), REG_EBRACK);
		REQUIRE(EATTWO(':', ']'), REG_ECTYPE);
		break;
	case '=':		/* equivalence class */
		NEXT2();
		REQUIRE(MORE(), REG_EBRACK);
		c = PEEK();
		REQUIRE(c != '-' && c != ']', REG_ECOLLATE);
		p_b_eclass(p, cs);
		REQUIRE(MORE(), REG_EBRACK);
		REQUIRE(EATTWO('=', ']'), REG_ECOLLATE);
		break;
	default:		/* symbol, ordinary character, or range */
/* xxx revision needed for multichar stuff */
		start = p_b_symbol(p);
		if (SEE('-') && MORE2() && PEEK2() != ']') {
			/* range */
			NEXT();
			if (EAT('-'))
				finish = '-';
			else
				finish = p_b_symbol(p);
		} else
			finish = start;
/* xxx what about signed chars here... */
		REQUIRE(start <= finish, REG_ERANGE);
		for (i = start; i <= finish; i++)
			CHadd(cs, i);
		break;
	}
}